

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool llvm::cl::ExpandResponseFiles
               (StringSaver *Saver,TokenizerCallback Tokenizer,SmallVectorImpl<const_char_*> *Argv,
               bool MarkEOLs,bool RelativeNames)

{
  void *pvVar1;
  bool bVar2;
  undefined1 From [8];
  bool bVar3;
  size_t sVar4;
  char *__s;
  StringRef local_b0;
  undefined1 local_a0 [8];
  SmallVector<const_char_*,_0U> ExpandedArgv;
  char *Arg;
  uint I;
  bool AllExpanded;
  uint RspFiles;
  bool RelativeNames_local;
  bool MarkEOLs_local;
  SmallVectorImpl<const_char_*> *Argv_local;
  TokenizerCallback Tokenizer_local;
  StringSaver *Saver_local;
  
  I = 0;
  bVar2 = true;
  Arg._0_4_ = 0;
  while( true ) {
    sVar4 = SmallVectorBase::size((SmallVectorBase *)Argv);
    if ((uint)Arg == sVar4) {
      return bVar2;
    }
    sVar4 = SmallVectorBase::size((SmallVectorBase *)Argv);
    if (sVar4 <= (uint)Arg) break;
    ExpandedArgv.super_SmallVectorImpl<const_char_*>.
    super_SmallVectorTemplateBase<const_char_*,_true>.
    super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase._8_8_ =
         *(undefined8 *)
          ((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                 super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX +
          (ulong)(uint)Arg * 8);
    if ((char *)ExpandedArgv.super_SmallVectorImpl<const_char_*>.
                super_SmallVectorTemplateBase<const_char_*,_true>.
                super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase._8_8_ ==
        (char *)0x0) {
      Arg._0_4_ = (uint)Arg + 1;
    }
    else if (*(char *)ExpandedArgv.super_SmallVectorImpl<const_char_*>.
                      super_SmallVectorTemplateBase<const_char_*,_true>.
                      super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.
                      _8_8_ == '@') {
      if (0x14 < I) {
        return false;
      }
      SmallVector<const_char_*,_0U>::SmallVector((SmallVector<const_char_*,_0U> *)local_a0);
      __s = (char *)(ExpandedArgv.super_SmallVectorImpl<const_char_*>.
                     super_SmallVectorTemplateBase<const_char_*,_true>.
                     super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase._8_8_
                    + 1);
      local_b0.Data = __s;
      if (__s != (char *)0x0) {
        strlen(__s);
      }
      bVar3 = ExpandResponseFile(local_b0,Saver,Tokenizer,(SmallVectorImpl<const_char_*> *)local_a0,
                                 MarkEOLs,RelativeNames);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        SmallVectorImpl<const_char_*>::erase
                  (Argv,(const_iterator)
                        ((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                               super_SmallVectorTemplateCommon<const_char_*,_void>.
                               super_SmallVectorBase.BeginX + (ulong)(uint)Arg * 8));
        From = local_a0;
        pvVar1 = (Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                 super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX;
        sVar4 = SmallVectorBase::size((SmallVectorBase *)local_a0);
        SmallVectorImpl<char_const*>::insert<char_const**,void>
                  ((SmallVectorImpl<char_const*> *)Argv,
                   (iterator)((long)pvVar1 + (ulong)(uint)Arg * 8),(char **)From,
                   (char **)((long)From + sVar4 * 8));
      }
      else {
        bVar2 = false;
        Arg._0_4_ = (uint)Arg + 1;
      }
      SmallVector<const_char_*,_0U>::~SmallVector((SmallVector<const_char_*,_0U> *)local_a0);
      I = I + 1;
    }
    else {
      Arg._0_4_ = (uint)Arg + 1;
    }
  }
  __assert_fail("idx < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x9b,
                "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
               );
}

Assistant:

bool cl::ExpandResponseFiles(StringSaver &Saver, TokenizerCallback Tokenizer,
                             SmallVectorImpl<const char *> &Argv,
                             bool MarkEOLs, bool RelativeNames) {
  unsigned RspFiles = 0;
  bool AllExpanded = true;

  // Don't cache Argv.size() because it can change.
  for (unsigned I = 0; I != Argv.size();) {
    const char *Arg = Argv[I];
    // Check if it is an EOL marker
    if (Arg == nullptr) {
      ++I;
      continue;
    }
    if (Arg[0] != '@') {
      ++I;
      continue;
    }

    // If we have too many response files, leave some unexpanded.  This avoids
    // crashing on self-referential response files.
    if (RspFiles++ > 20)
      return false;

    // Replace this response file argument with the tokenization of its
    // contents.  Nested response files are expanded in subsequent iterations.
    SmallVector<const char *, 0> ExpandedArgv;
    if (!ExpandResponseFile(Arg + 1, Saver, Tokenizer, ExpandedArgv,
                            MarkEOLs, RelativeNames)) {
      // We couldn't read this file, so we leave it in the argument stream and
      // move on.
      AllExpanded = false;
      ++I;
      continue;
    }
    Argv.erase(Argv.begin() + I);
    Argv.insert(Argv.begin() + I, ExpandedArgv.begin(), ExpandedArgv.end());
  }
  return AllExpanded;
}